

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.hpp
# Opt level: O2

double __thiscall tfs::TMatrix<double>::sum(TMatrix<double> *this)

{
  bool bVar1;
  double *pdVar2;
  double dVar3;
  
  bVar1 = isEmpty(this);
  if (bVar1) {
    report_problem("Error",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/../src/Matrix.hpp"
                   ,"sum",0x189,"empty matrix");
    dVar3 = 0.0;
  }
  else {
    pdVar2 = this->m_data;
    dVar3 = *pdVar2;
    while (pdVar2 = pdVar2 + 1, pdVar2 < this->m_end) {
      dVar3 = dVar3 + *pdVar2;
    }
  }
  return dVar3;
}

Assistant:

inline T sum( void ) const {                    // Return sum of matrix elements.
            if( isEmpty()) {
                log_error( "empty matrix" );
                return 0;
            }
            const T *      data = m_data;
            const T * const end = m_end;
            
            T result = *data++;
            while( data < end ) {
                result += *data++;
            }
            return result;
        }